

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O3

void * mpp_buffer_get_ptr_with_caller(MppBuffer buffer,char *caller)

{
  void *pvVar1;
  undefined4 uVar2;
  
  if (buffer == (MppBuffer)0x0) {
    pvVar1 = (void *)0x0;
    _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_ptr invalid NULL input from %s\n",(char *)0x0,caller);
  }
  else {
    pvVar1 = *(void **)((long)buffer + 0x90);
    if (pvVar1 == (void *)0x0) {
      mpp_buffer_mmap((MppBufferImpl *)buffer,caller);
      pvVar1 = *(void **)((long)buffer + 0x90);
      if (pvVar1 == (void *)0x0) {
        uVar2 = 0xb2;
        _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "p->info.ptr != __null","mpp_buffer_get_ptr_with_caller",0xb2);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
          abort();
        }
        pvVar1 = *(void **)((long)buffer + 0x90);
        if (pvVar1 == (void *)0x0) {
          _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_ptr buffer %p ret NULL from %s\n",(char *)0x0,
                     buffer,caller,uVar2);
          pvVar1 = *(void **)((long)buffer + 0x90);
        }
      }
    }
  }
  return pvVar1;
}

Assistant:

void *mpp_buffer_get_ptr_with_caller(MppBuffer buffer, const char *caller)
{
    if (NULL == buffer) {
        mpp_err("mpp_buffer_get_ptr invalid NULL input from %s\n", caller);
        return NULL;
    }

    MppBufferImpl *p = (MppBufferImpl*)buffer;
    if (NULL == p->info.ptr)
        mpp_buffer_mmap(p, caller);

    mpp_assert(p->info.ptr != NULL);
    if (NULL == p->info.ptr)
        mpp_err("mpp_buffer_get_ptr buffer %p ret NULL from %s\n", buffer, caller);

    return p->info.ptr;
}